

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize
          (TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  undefined8 *puVar1;
  Fad<Fad<double>_> *pFVar2;
  undefined1 auVar3 [16];
  Fad<Fad<double>_> *pFVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  Vector<double> *a;
  Vector<Fad<double>_> *pVVar9;
  long lVar10;
  long lVar11;
  Vector<double> *pVVar12;
  ulong uVar13;
  Fad<double> *pFVar14;
  double dVar15;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar10 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
  if (newsize != lVar10) {
    lVar11 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc;
    if (lVar11 < newsize) {
      if ((ulong)newsize < 4) {
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        else {
          lVar11 = 0;
          lVar10 = 0;
          do {
            pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
            a = (Vector<double> *)((long)&(pFVar2->val_).dx_.num_elts + lVar11);
            pVVar12 = (Vector<double> *)((long)&this->fExtAlloc[0].val_.dx_.num_elts + lVar11);
            pVVar12[-1].ptr_to_data = a[-1].ptr_to_data;
            Vector<double>::operator=(pVVar12,a);
            uVar5 = *(undefined4 *)&a[1].field_0x4;
            pVVar12[1].num_elts = a[1].num_elts;
            *(undefined4 *)&pVVar12[1].field_0x4 = uVar5;
            pVVar9 = (Vector<Fad<double>_> *)((long)&(pFVar2->dx_).num_elts + lVar11);
            Vector<Fad<double>_>::operator=
                      ((Vector<Fad<double>_> *)((long)&this->fExtAlloc[0].dx_.num_elts + lVar11),
                       pVVar9);
            *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal.val_ + lVar11) =
                 *(undefined8 *)(pVVar9 + 1);
            pVVar12 = (Vector<double> *)((long)&(pFVar2->defaultVal).dx_.num_elts + lVar11);
            Vector<double>::operator=
                      ((Vector<double> *)
                       ((long)&this->fExtAlloc[0].defaultVal.dx_.num_elts + lVar11),pVVar12);
            *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal.defaultVal + lVar11) =
                 *(undefined8 *)(pVVar12 + 1);
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x58;
          } while (lVar10 < (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements);
        }
        lVar11 = newsize - lVar10;
        if (lVar11 != 0 && lVar10 <= newsize) {
          pVVar9 = &this->fExtAlloc[lVar10].dx_;
          do {
            *(double *)(pVVar9 + -2) = (object->val_).val_;
            Vector<double>::operator=((Vector<double> *)&pVVar9[-2].ptr_to_data,&(object->val_).dx_)
            ;
            pVVar9[-1].ptr_to_data = (Fad<double> *)(object->val_).defaultVal;
            Vector<Fad<double>_>::operator=(pVVar9,&object->dx_);
            *(double *)(pVVar9 + 1) = (object->defaultVal).val_;
            Vector<double>::operator=
                      ((Vector<double> *)&pVVar9[1].ptr_to_data,&(object->defaultVal).dx_);
            pVVar9[2].ptr_to_data = (Fad<double> *)(object->defaultVal).defaultVal;
            pVVar9 = (Vector<Fad<double>_> *)&pVVar9[5].ptr_to_data;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
        if (pFVar2 != (Fad<Fad<double>_> *)0x0 && pFVar2 != this->fExtAlloc) {
          dVar15 = pFVar2[-1].defaultVal.defaultVal;
          if (dVar15 != 0.0) {
            pFVar4 = pFVar2 + (long)dVar15 + -1;
            lVar10 = (long)dVar15 * -0x58;
            do {
              pFVar14 = &pFVar4->val_;
              Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar14 + 1) + 1));
              Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar14 + 1));
              Fad<double>::~Fad(pFVar14);
              pFVar4 = (Fad<Fad<double>_> *)(pFVar14 + -3);
              lVar10 = lVar10 + 0x58;
            } while (lVar10 != 0);
          }
          operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar15 * 0x58 + 8);
        }
        (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 3;
      }
      else {
        dVar15 = (double)lVar11 * 1.2;
        uVar13 = (long)dVar15;
        if (dVar15 < (double)newsize) {
          uVar13 = newsize;
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar13;
        uVar6 = SUB168(auVar3 * ZEXT816(0x58),0);
        uVar7 = uVar6 + 8;
        if (0xfffffffffffffff7 < uVar6) {
          uVar7 = 0xffffffffffffffff;
        }
        uVar6 = 0xffffffffffffffff;
        if (SUB168(auVar3 * ZEXT816(0x58),8) == 0) {
          uVar6 = uVar7;
        }
        puVar8 = (ulong *)operator_new__(uVar6);
        *puVar8 = uVar13;
        if (uVar13 != 0) {
          lVar11 = 0;
          do {
            *(undefined8 *)((long)puVar8 + lVar11 + 0x10) = 0;
            *(undefined4 *)((long)puVar8 + lVar11 + 0x18) = 0;
            puVar1 = (undefined8 *)((long)puVar8 + lVar11 + 0x50);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)((long)puVar8 + lVar11 + 0x20);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)puVar8 + lVar11 + 0x30) = 0;
            puVar1 = (undefined8 *)((long)puVar8 + lVar11 + 0x38);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)puVar8 + lVar11 + 0x48) = 0;
            lVar11 = lVar11 + 0x58;
          } while (uVar13 * 0x58 - lVar11 != 0);
        }
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        else {
          lVar11 = 0;
          lVar10 = 0;
          do {
            pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
            *(undefined8 *)((long)puVar8 + lVar11 + 0x10) =
                 *(undefined8 *)((long)&(pFVar2->val_).val_ + lVar11);
            Vector<double>::operator=
                      ((Vector<double> *)((long)puVar8 + lVar11 + 0x18),
                       (Vector<double> *)((long)&(pFVar2->val_).dx_.num_elts + lVar11));
            *(undefined8 *)((long)puVar8 + lVar11 + 0x28) =
                 *(undefined8 *)((long)&(pFVar2->val_).defaultVal + lVar11);
            Vector<Fad<double>_>::operator=
                      ((Vector<Fad<double>_> *)((long)puVar8 + lVar11 + 0x30),
                       (Vector<Fad<double>_> *)((long)&(pFVar2->dx_).num_elts + lVar11));
            *(undefined8 *)((long)puVar8 + lVar11 + 0x40) =
                 *(undefined8 *)((long)&(pFVar2->defaultVal).val_ + lVar11);
            Vector<double>::operator=
                      ((Vector<double> *)((long)puVar8 + lVar11 + 0x48),
                       (Vector<double> *)((long)&(pFVar2->defaultVal).dx_.num_elts + lVar11));
            *(undefined8 *)((long)puVar8 + lVar11 + 0x58) =
                 *(undefined8 *)((long)&(pFVar2->defaultVal).defaultVal + lVar11);
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x58;
          } while (lVar10 < (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements);
        }
        lVar11 = newsize - lVar10;
        if (lVar11 != 0 && lVar10 <= newsize) {
          pVVar9 = (Vector<Fad<double>_> *)(puVar8 + lVar10 * 0xb + 6);
          do {
            *(double *)(pVVar9 + -2) = (object->val_).val_;
            Vector<double>::operator=((Vector<double> *)&pVVar9[-2].ptr_to_data,&(object->val_).dx_)
            ;
            pVVar9[-1].ptr_to_data = (Fad<double> *)(object->val_).defaultVal;
            Vector<Fad<double>_>::operator=(pVVar9,&object->dx_);
            *(double *)(pVVar9 + 1) = (object->defaultVal).val_;
            Vector<double>::operator=
                      ((Vector<double> *)&pVVar9[1].ptr_to_data,&(object->defaultVal).dx_);
            pVVar9[2].ptr_to_data = (Fad<double> *)(object->defaultVal).defaultVal;
            pVVar9 = (Vector<Fad<double>_> *)&pVVar9[5].ptr_to_data;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
        if (pFVar2 != (Fad<Fad<double>_> *)0x0 && pFVar2 != this->fExtAlloc) {
          dVar15 = pFVar2[-1].defaultVal.defaultVal;
          if (dVar15 != 0.0) {
            pFVar4 = pFVar2 + (long)dVar15 + -1;
            lVar10 = (long)dVar15 * -0x58;
            do {
              pFVar14 = &pFVar4->val_;
              Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(pFVar14 + 1) + 1));
              Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(pFVar14 + 1));
              Fad<double>::~Fad(pFVar14);
              pFVar4 = (Fad<Fad<double>_> *)(pFVar14 + -3);
              lVar10 = lVar10 + 0x58;
            } while (lVar10 != 0);
          }
          operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar15 * 0x58 + 8);
        }
        (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = (Fad<Fad<double>_> *)(puVar8 + 1);
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar13;
      }
    }
    else {
      lVar11 = newsize - lVar10;
      if (lVar11 != 0 && lVar10 <= newsize) {
        lVar10 = lVar10 * 0x58 + 0x28;
        do {
          pFVar2 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          pVVar12 = (Vector<double> *)((long)pFVar2 + lVar10 + -0x18);
          pVVar12[-1].ptr_to_data = (double *)(object->val_).val_;
          Vector<double>::operator=(pVVar12,&(object->val_).dx_);
          *(double *)(pVVar12 + 1) = (object->val_).defaultVal;
          Vector<Fad<double>_>::operator=
                    ((Vector<Fad<double>_> *)(&pFVar2->field_0x0 + lVar10),&object->dx_);
          pVVar12[2].ptr_to_data = (double *)(object->defaultVal).val_;
          pVVar12 = (Vector<double> *)((long)&(pFVar2->val_).dx_.ptr_to_data + lVar10);
          Vector<double>::operator=(pVVar12,&(object->defaultVal).dx_);
          *(double *)(pVVar12 + 1) = (object->defaultVal).defaultVal;
          lVar10 = lVar10 + 0x58;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}